

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O1

void feat_s2_4x_cep2feat(feat_t *fcb,mfcc_t **mfc,mfcc_t **feat)

{
  int iVar1;
  uint32 *puVar2;
  mfcc_t *pmVar3;
  mfcc_t *pmVar4;
  float *pfVar5;
  float *pfVar6;
  mfcc_t *pmVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  
  if (fcb == (feat_t *)0x0) {
    __assert_fail("fcb",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/feat.c"
                  ,0x1b1,"void feat_s2_4x_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  if (fcb->cepsize != 0xd) {
    __assert_fail("feat_cepsize(fcb) == 13",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/feat.c"
                  ,0x1b2,"void feat_s2_4x_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  if (fcb->n_stream != 4) {
    __assert_fail("feat_n_stream(fcb) == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/feat.c"
                  ,0x1b3,"void feat_s2_4x_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  puVar2 = fcb->stream_len;
  if (*puVar2 != 0xc) {
    __assert_fail("feat_stream_len(fcb, 0) == 12",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/feat.c"
                  ,0x1b4,"void feat_s2_4x_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  if (puVar2[1] != 0x18) {
    __assert_fail("feat_stream_len(fcb, 1) == 24",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/feat.c"
                  ,0x1b5,"void feat_s2_4x_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  if (puVar2[2] != 3) {
    __assert_fail("feat_stream_len(fcb, 2) == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/feat.c"
                  ,0x1b6,"void feat_s2_4x_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  if (puVar2[3] != 0xc) {
    __assert_fail("feat_stream_len(fcb, 3) == 12",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/feat.c"
                  ,0x1b7,"void feat_s2_4x_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  if (fcb->window_size == 4) {
    pmVar3 = *feat;
    pmVar4 = *mfc;
    uVar12 = *(undefined8 *)(pmVar4 + 1);
    uVar13 = *(undefined8 *)(pmVar4 + 3);
    uVar14 = *(undefined8 *)(pmVar4 + 5);
    uVar15 = *(undefined8 *)(pmVar4 + 7);
    uVar16 = *(undefined8 *)(pmVar4 + 0xb);
    *(undefined8 *)(pmVar3 + 8) = *(undefined8 *)(pmVar4 + 9);
    *(undefined8 *)(pmVar3 + 10) = uVar16;
    *(undefined8 *)(pmVar3 + 4) = uVar14;
    *(undefined8 *)(pmVar3 + 6) = uVar15;
    *(undefined8 *)pmVar3 = uVar12;
    *(undefined8 *)(pmVar3 + 2) = uVar13;
    pfVar5 = (float *)mfc[-2];
    pfVar6 = (float *)mfc[2];
    pmVar3 = feat[1];
    iVar1 = fcb->cepsize;
    uVar17 = (ulong)(iVar1 - 1);
    uVar18 = 0;
    if (1 < iVar1) {
      do {
        pmVar3[uVar18] = (mfcc_t)(pfVar6[uVar18 + 1] - pfVar5[uVar18 + 1]);
        uVar18 = uVar18 + 1;
      } while (uVar17 != uVar18);
    }
    if (1 < iVar1) {
      pmVar4 = mfc[-4];
      pmVar7 = mfc[4];
      uVar19 = 0;
      do {
        pmVar3[uVar18 + uVar19] = (mfcc_t)((float)pmVar7[uVar19 + 1] - (float)pmVar4[uVar19 + 1]);
        uVar19 = uVar19 + 1;
      } while (uVar17 != uVar19);
    }
    pfVar8 = (float *)mfc[3];
    pfVar9 = (float *)mfc[-3];
    pfVar10 = (float *)mfc[-1];
    pfVar11 = (float *)mfc[1];
    if (1 < iVar1) {
      pmVar3 = feat[3];
      uVar18 = 0;
      do {
        pmVar3[uVar18] =
             (mfcc_t)((pfVar8[uVar18 + 1] - pfVar10[uVar18 + 1]) -
                     (pfVar11[uVar18 + 1] - pfVar9[uVar18 + 1]));
        uVar18 = uVar18 + 1;
      } while (uVar17 != uVar18);
    }
    pmVar3 = feat[2];
    *pmVar3 = **mfc;
    pmVar3[1] = (mfcc_t)(*pfVar6 - *pfVar5);
    pmVar3[2] = (mfcc_t)((*pfVar8 - *pfVar10) - (*pfVar11 - *pfVar9));
    return;
  }
  __assert_fail("feat_window_size(fcb) == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/feat.c"
                ,0x1b8,"void feat_s2_4x_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
}

Assistant:

static void
feat_s2_4x_cep2feat(feat_t * fcb, mfcc_t ** mfc, mfcc_t ** feat)
{
    mfcc_t *f;
    mfcc_t *w, *_w;
    mfcc_t *w1, *w_1, *_w1, *_w_1;
    mfcc_t d1, d2;
    int32 i, j;

    assert(fcb);
    assert(feat_cepsize(fcb) == 13);
    assert(feat_n_stream(fcb) == 4);
    assert(feat_stream_len(fcb, 0) == 12);
    assert(feat_stream_len(fcb, 1) == 24);
    assert(feat_stream_len(fcb, 2) == 3);
    assert(feat_stream_len(fcb, 3) == 12);
    assert(feat_window_size(fcb) == 4);

    /* CEP; skip C0 */
    memcpy(feat[0], mfc[0] + 1, (feat_cepsize(fcb) - 1) * sizeof(mfcc_t));

    /*
     * DCEP(SHORT): mfc[2] - mfc[-2]
     * DCEP(LONG):  mfc[4] - mfc[-4]
     */
    w = mfc[2] + 1;             /* +1 to skip C0 */
    _w = mfc[-2] + 1;

    f = feat[1];
    for (i = 0; i < feat_cepsize(fcb) - 1; i++) /* Short-term */
        f[i] = w[i] - _w[i];

    w = mfc[4] + 1;             /* +1 to skip C0 */
    _w = mfc[-4] + 1;

    for (j = 0; j < feat_cepsize(fcb) - 1; i++, j++)    /* Long-term */
        f[i] = w[j] - _w[j];

    /* D2CEP: (mfc[3] - mfc[-1]) - (mfc[1] - mfc[-3]) */
    w1 = mfc[3] + 1;            /* Final +1 to skip C0 */
    _w1 = mfc[-1] + 1;
    w_1 = mfc[1] + 1;
    _w_1 = mfc[-3] + 1;

    f = feat[3];
    for (i = 0; i < feat_cepsize(fcb) - 1; i++) {
        d1 = w1[i] - _w1[i];
        d2 = w_1[i] - _w_1[i];

        f[i] = d1 - d2;
    }

    /* POW: C0, DC0, D2C0; differences computed as above for rest of cep */
    f = feat[2];
    f[0] = mfc[0][0];
    f[1] = mfc[2][0] - mfc[-2][0];

    d1 = mfc[3][0] - mfc[-1][0];
    d2 = mfc[1][0] - mfc[-3][0];
    f[2] = d1 - d2;
}